

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTreeViewItem>::insert
          (QMovableArrayOps<QTreeViewItem> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QTreeViewItem **ppQVar1;
  qsizetype *pqVar2;
  QTreeViewItem *pQVar3;
  long in_FS_OFFSET;
  bool bVar4;
  Inserter local_80;
  undefined8 local_58;
  quintptr qStack_50;
  QAbstractItemModel *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = *(undefined8 *)&t->field_0x20;
  local_58._0_4_ = (t->index).r;
  local_58._4_4_ = (t->index).c;
  qStack_50 = (t->index).i;
  local_48 = (t->index).m.ptr;
  uStack_40 = *(undefined8 *)&t->parentItem;
  bVar4 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.size
          != 0;
  QArrayDataPointer<QTreeViewItem>::detachAndGrow
            ((QArrayDataPointer<QTreeViewItem> *)this,(uint)(i == 0 && bVar4),n,
             (QTreeViewItem **)0x0,(QArrayDataPointer<QTreeViewItem> *)0x0);
  if (i == 0 && bVar4) {
    while (bVar4 = n != 0, n = n + -1, bVar4) {
      pQVar3 = (this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>.
               ptr;
      *(undefined8 *)&pQVar3[-1].field_0x20 = local_38;
      pQVar3[-1].index.m.ptr = local_48;
      *(undefined8 *)&pQVar3[-1].parentItem = uStack_40;
      pQVar3[-1].index.r = (undefined4)local_58;
      pQVar3[-1].index.c = local_58._4_4_;
      pQVar3[-1].index.i = qStack_50;
      ppQVar1 = &(this->super_QGenericArrayOps<QTreeViewItem>).
                 super_QArrayDataPointer<QTreeViewItem>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QTreeViewItem>).super_QArrayDataPointer<QTreeViewItem>
                .size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QTreeViewItem> *)this,i,n);
    while (bVar4 = n != 0, n = n + -1, bVar4) {
      *(undefined8 *)&(local_80.displaceFrom)->field_0x20 = local_38;
      ((local_80.displaceFrom)->index).m.ptr = local_48;
      *(undefined8 *)&(local_80.displaceFrom)->parentItem = uStack_40;
      ((local_80.displaceFrom)->index).r = (undefined4)local_58;
      ((local_80.displaceFrom)->index).c = local_58._4_4_;
      ((local_80.displaceFrom)->index).i = qStack_50;
      local_80.displaceFrom = local_80.displaceFrom + 1;
    }
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }